

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O0

void __thiscall
glcts::DrawBuffersIndexedColorMasks::releaseFramebuffer(DrawBuffersIndexedColorMasks *this)

{
  Context *context;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  ResourceError *this_00;
  TestLog *log;
  undefined4 local_84;
  undefined1 local_80 [4];
  GLenum bufs [1];
  BlendMaskStateMachine state;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  long lStack_18;
  GLint maxDrawBuffers;
  Functions *gl;
  DrawBuffersIndexedColorMasks *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  local_1c = 0;
  (**(code **)(lStack_18 + 0x868))(0x8824,&local_1c);
  if (local_1c < 4) {
    this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Minimum number of draw buffers too low",&local_41);
    tcu::ResourceError::ResourceError(this_00,&local_40);
    __cxa_throw(this_00,&tcu::ResourceError::typeinfo,tcu::ResourceError::~ResourceError);
  }
  context = (this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context;
  log = tcu::TestContext::getLog
                  ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                   super_TestNode.m_testCtx);
  DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
            ((BlendMaskStateMachine *)local_80,context,log,local_1c);
  DrawBuffersIndexedBase::BlendMaskStateMachine::SetDefaults((BlendMaskStateMachine *)local_80);
  (**(code **)(lStack_18 + 0x440))(1,&this->m_fbo);
  (**(code **)(lStack_18 + 0x78))(0x8d40,0);
  local_84 = 0x405;
  (**(code **)(lStack_18 + 0x560))(1,&local_84);
  (**(code **)(lStack_18 + 0x1218))(0x405);
  DrawBuffersIndexedBase::BlendMaskStateMachine::~BlendMaskStateMachine
            ((BlendMaskStateMachine *)local_80);
  return;
}

Assistant:

void DrawBuffersIndexedColorMasks::releaseFramebuffer()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		throw tcu::ResourceError("Minimum number of draw buffers too low");
	}

	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);
	state.SetDefaults();
	gl.deleteFramebuffers(1, &m_fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	glw::GLenum bufs[1] = { GL_BACK };
	gl.drawBuffers(1, bufs);
	gl.readBuffer(GL_BACK);
}